

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.c
# Opt level: O3

uint8_t * LoadImage(char *imagePath)

{
  stbi_uc *__src;
  uint8_t *__dest;
  size_t __size;
  int channels;
  int height;
  int width;
  uint local_44;
  uint local_40;
  uint local_3c;
  char *local_38;
  
  stbi__vertically_flip_on_load_global = 1;
  __src = stbi_load(imagePath,(int *)&local_3c,(int *)&local_40,(int *)&local_44,0);
  if (__src == (stbi_uc *)0x0) {
    LoadImage_cold_1();
    __dest = (uint8_t *)0x0;
  }
  else {
    __size = (long)(int)local_40 * (long)(int)local_3c * (long)(int)local_44;
    local_38 = imagePath;
    __dest = (uint8_t *)malloc(__size);
    memcpy(__dest,__src,__size);
    printf("Loaded image %s successfully!\nWidth: %d Height: %d Channels %d\n",local_38,
           (ulong)local_3c,(ulong)local_40,(ulong)local_44);
    free(__src);
  }
  return __dest;
}

Assistant:

uint8_t * LoadImage(const char * imagePath) {
    stbi_set_flip_vertically_on_load(1);
    int width, height, channels;
    uint8_t * imageBuffer = stbi_load(imagePath, &width, &height, &channels, 0);
    if (imageBuffer == NULL) {
        fprintf(stderr, "Can't load image!\n");
        return NULL;
    }
    uint8_t * image = malloc(sizeof(uint8_t) * width * height * channels);
    memcpy(image, imageBuffer, sizeof(uint8_t) * width * height * channels);
    printf("Loaded image %s successfully!\nWidth: %d Height: %d Channels %d\n", imagePath, width, height, channels);
    FreeImage(imageBuffer);
    return image;
}